

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction_job.tpl.h
# Opt level: O2

bool __thiscall
r_exec::ReductionJob<r_exec::PrimaryMDLController>::update
          (ReductionJob<r_exec::PrimaryMDLController> *this,uint64_t now)

{
  _Mem *this_00;
  
  this_00 = (_Mem *)r_code::Mem::Get();
  _Mem::register_reduction_job_latency(this_00,now - (this->super__ReductionJob).ijt);
  PrimaryMDLController::reduce
            ((PrimaryMDLController *)(this->processor).object,(View *)(this->input).object);
  return true;
}

Assistant:

bool ReductionJob<_P>::update(uint64_t now)
{
    _Mem::Get()->register_reduction_job_latency(now - ijt);
    processor->reduce(input);
    return true;
}